

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O1

void __thiscall cli::Parser::Parser(Parser *this,int argc,char **argv)

{
  ulong uVar1;
  allocator local_59;
  Parser *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,*argv,(allocator *)&local_50);
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_commands).
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = this;
  if (1 < argc) {
    uVar1 = 1;
    do {
      std::__cxx11::string::string((string *)&local_50,argv[uVar1],&local_59);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->_arguments,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  enable_help(local_58);
  return;
}

Assistant:

explicit Parser(int argc, char** argv) : 
			_appname(argv[0]) {
			for (int i = 1; i < argc; ++i) {
				_arguments.push_back(argv[i]);
			}
			enable_help();
		}